

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O2

bool crnlib::string_to_int64(char **pBuf,int64 *value)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  
  *value = 0;
  pcVar7 = *pBuf;
  while( true ) {
    cVar2 = *pcVar7;
    if (cVar2 == '\0') {
      return false;
    }
    iVar3 = isspace((int)cVar2);
    if (iVar3 == 0) break;
    pcVar7 = pcVar7 + 1;
  }
  uVar1 = (int)cVar2 - 0x3a;
  if (uVar1 < 0xfffffff6) {
    if (cVar2 != '-') {
      return false;
    }
    pcVar7 = pcVar7 + 1;
  }
  uVar4 = 0;
  while( true ) {
    if ((*pcVar7 == '\0') || (uVar5 = (int)*pcVar7 - 0x30, 9 < uVar5)) {
      if (uVar1 < 0xfffffff6) {
        if (0x8000000000000000 < uVar4) {
          return false;
        }
        uVar4 = -uVar4;
      }
      else if ((long)uVar4 < 0) {
        return false;
      }
      *value = uVar4;
      *pBuf = pcVar7;
      return true;
    }
    if (uVar4 >> 0x3d != 0) {
      return false;
    }
    if (CARRY8(uVar4 * 8,uVar4 * 2)) break;
    uVar6 = uVar4 * 10;
    pcVar7 = pcVar7 + 1;
    uVar4 = uVar5 + uVar6;
    if (CARRY8((ulong)uVar5,uVar6)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool string_to_int64(const char*& pBuf, int64& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint64 result = 0;
        bool negative = false;

        if (!isdigit(*p))
        {
            if (p[0] == '-')
            {
                negative = true;
                p++;
            }
            else
            {
                return false;
            }
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE000000000000000ULL)
            {
                return false;
            }

            const uint64 result8 = result << 3U;
            const uint64 result2 = result << 1U;

            if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFFFFFFFFFULL - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        if (negative)
        {
            if (result > 0x8000000000000000ULL)
            {
                value = 0;
                return false;
            }
            value = -static_cast<int64>(result);
        }
        else
        {
            if (result > 0x7FFFFFFFFFFFFFFFULL)
            {
                value = 0;
                return false;
            }
            value = static_cast<int64>(result);
        }

        pBuf = p;

        return true;
    }